

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QSize __thiscall QDockAreaLayoutInfo::minimumSize(QDockAreaLayoutInfo *this)

{
  Representation RVar1;
  bool bVar2;
  bool bVar3;
  QSize QVar4;
  QSize QVar5;
  Representation RVar6;
  QSize QVar7;
  Representation RVar8;
  Orientation OVar9;
  int i;
  ulong uVar10;
  Representation RVar11;
  QSize QVar12;
  QDockAreaLayoutItem *this_00;
  QSize QVar13;
  long lVar14;
  
  bVar2 = isEmpty(this);
  QVar7.wd.m_i = 0;
  QVar7.ht.m_i = 0;
  QVar4.wd.m_i = 0;
  QVar4.ht.m_i = 0;
  if (!bVar2) {
    bVar2 = true;
    lVar14 = 0;
    uVar10 = 0;
    QVar5.wd.m_i = 0;
    QVar5.ht.m_i = 0;
    QVar12.wd.m_i = 0;
    QVar12.ht.m_i = 0;
    while( true ) {
      RVar11 = QVar12.wd.m_i;
      if ((ulong)(this->item_list).d.size <= uVar10) break;
      this_00 = (QDockAreaLayoutItem *)((long)&((this->item_list).d.ptr)->widgetItem + lVar14);
      bVar3 = QDockAreaLayoutItem::skip(this_00);
      if (!bVar3) {
        QVar4 = QDockAreaLayoutItem::minimumSize(this_00);
        RVar6 = QVar4.ht.m_i;
        RVar1 = QVar4.wd.m_i;
        if (this->tabbed == true) {
          OVar9 = this->o;
          RVar8.m_i = RVar6.m_i;
          if (OVar9 == Horizontal) {
            RVar8.m_i = RVar1.m_i;
          }
          if (RVar8.m_i < RVar11.m_i) {
            RVar8.m_i = RVar11.m_i;
          }
        }
        else {
          if (!bVar2) {
            RVar11.m_i = RVar11.m_i + *this->sep;
          }
          OVar9 = this->o;
          RVar8.m_i = RVar6.m_i;
          if (OVar9 == Horizontal) {
            RVar8.m_i = RVar1.m_i;
          }
          RVar8.m_i = RVar8.m_i + RVar11.m_i;
        }
        if (OVar9 == Vertical) {
          RVar6.m_i = RVar1.m_i;
        }
        if (RVar6.m_i < QVar5.wd.m_i.m_i) {
          RVar6.m_i = QVar5.wd.m_i.m_i;
        }
        bVar2 = false;
        QVar5.ht.m_i = 0;
        QVar5.wd.m_i = RVar6.m_i;
        QVar12.ht.m_i = 0;
        QVar12.wd.m_i = RVar8.m_i;
      }
      uVar10 = uVar10 + 1;
      lVar14 = lVar14 + 0x28;
    }
    QVar4 = QVar12;
    QVar13 = QVar5;
    if ((this->o != Horizontal) && (QVar4 = QVar5, QVar13 = QVar12, this->o != Vertical)) {
      QVar4.wd.m_i = -1;
      QVar4.ht.m_i = -1;
      QVar13 = QVar5;
    }
    QVar5 = tabBarMinimumSize(this);
    RVar11 = QVar5.wd.m_i;
    QVar7 = QVar13;
    if (((QSize)((ulong)QVar5 >> 0x20) != (QSize)0x0 || RVar11.m_i != 0) &&
       ((uint)this->tabBarShape < 8)) {
      if ((0x33U >> (this->tabBarShape & 0x1fU) & 1) == 0) {
        QVar7 = (QSize)((ulong)QVar5 >> 0x20);
        if (QVar5.ht.m_i.m_i < QVar13.wd.m_i.m_i) {
          QVar7 = QVar13;
        }
        QVar4.wd.m_i = QVar4.wd.m_i.m_i + RVar11.m_i;
        QVar4.ht.m_i = 0;
      }
      else {
        QVar7.wd.m_i = QVar13.wd.m_i.m_i + QVar5.ht.m_i.m_i;
        QVar7.ht.m_i = 0;
        if (QVar4.wd.m_i.m_i <= RVar11.m_i) {
          QVar4 = QVar5;
        }
        QVar4 = (QSize)((ulong)QVar4 & 0xffffffff);
      }
    }
  }
  return (QSize)((ulong)QVar4 & 0xffffffff | (long)QVar7 << 0x20);
}

Assistant:

QSize QDockAreaLayoutInfo::minimumSize() const
{
    if (isEmpty())
        return QSize(0, 0);

    int a = 0, b = 0;
    bool first = true;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        QSize min_size = item.minimumSize();
#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMax(a, pick(o, min_size));
        } else
#endif
        {
            if (!first)
                a += *sep;
            a += pick(o, min_size);
        }
        b = qMax(b, perp(o, min_size));

        first = false;
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    QSize tbm = tabBarMinimumSize();
    if (!tbm.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularNorth:
            case QTabBar::TriangularSouth:
                result.rheight() += tbm.height();
                result.rwidth() = qMax(tbm.width(), result.width());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
            case QTabBar::TriangularEast:
            case QTabBar::TriangularWest:
                result.rheight() = qMax(tbm.height(), result.height());
                result.rwidth() += tbm.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}